

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>::Swap
          (RepeatedFieldPrimitiveAccessor<bool> *this,Field *data,
          RepeatedFieldAccessor *other_mutator,Field *other_data)

{
  Field *in_RCX;
  long in_RDX;
  Field *in_RSI;
  long in_RDI;
  LogMessage *in_stack_ffffffffffffff78;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff88;
  LogMessage *in_stack_ffffffffffffff90;
  RepeatedField<bool> *in_stack_ffffffffffffffa8;
  RepeatedField<bool> *in_stack_ffffffffffffffb0;
  
  if (in_RDI != in_RDX) {
    this_00 = (LogMessage *)&stack0xffffffffffffffa8;
    LogMessage::LogMessage
              (in_stack_ffffffffffffff90,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff88 >> 0x20),(char *)this_00,
               (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    LogMessage::operator<<(this_00,(char *)in_stack_ffffffffffffff78);
    LogFinisher::operator=((LogFinisher *)this_00,in_stack_ffffffffffffff78);
    LogMessage::~LogMessage((LogMessage *)0x42e9ea);
  }
  RepeatedFieldWrapper<bool>::MutableRepeatedField(in_RSI);
  RepeatedFieldWrapper<bool>::MutableRepeatedField(in_RCX);
  RepeatedField<bool>::Swap(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    // Currently RepeatedFieldPrimitiveAccessor is the only implementation of
    // RepeatedFieldAccessor for primitive types. As we are using singletons
    // for these accessors, here "other_mutator" must be "this".
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }